

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommandArgumentParserHelper.cxx
# Opt level: O0

char * __thiscall
cmCommandArgumentParserHelper::ExpandSpecialVariable
          (cmCommandArgumentParserHelper *this,char *key,char *var)

{
  string_view sVar1;
  undefined8 __s;
  bool bVar2;
  int iVar3;
  cmState *this_00;
  string *psVar4;
  ostream *poVar5;
  string local_288;
  ostringstream local_268 [8];
  ostringstream e;
  string local_e0;
  allocator<char> local_b9;
  string local_b8;
  cmValue local_98;
  cmValue c;
  string local_78;
  undefined1 local_48 [8];
  string str;
  char *var_local;
  char *key_local;
  cmCommandArgumentParserHelper *this_local;
  
  str.field_2._8_8_ = var;
  if (key == (char *)0x0) {
    this_local = (cmCommandArgumentParserHelper *)ExpandVariable(this,var);
  }
  else if (var == (char *)0x0) {
    this_local = (cmCommandArgumentParserHelper *)0xc7f107;
  }
  else {
    iVar3 = strcmp(key,"ENV");
    if (iVar3 == 0) {
      std::__cxx11::string::string((string *)local_48);
      bVar2 = cmsys::SystemTools::GetEnv((char *)str.field_2._8_8_,(string *)local_48);
      if (bVar2) {
        if ((this->EscapeQuotes & 1U) == 0) {
          this_local = (cmCommandArgumentParserHelper *)AddString(this,(string *)local_48);
        }
        else {
          sVar1 = (string_view)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_48);
          cmEscapeQuotes_abi_cxx11_(&local_78,sVar1);
          this_local = (cmCommandArgumentParserHelper *)AddString(this,&local_78);
          std::__cxx11::string::~string((string *)&local_78);
        }
      }
      else {
        this_local = (cmCommandArgumentParserHelper *)0xc7f107;
      }
      c.Value._4_4_ = 1;
      std::__cxx11::string::~string((string *)local_48);
    }
    else {
      iVar3 = strcmp(key,"CACHE");
      if (iVar3 == 0) {
        this_00 = cmMakefile::GetState(this->Makefile);
        __s = str.field_2._8_8_;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_b8,(char *)__s,&local_b9);
        local_98 = cmState::GetInitializedCacheValue(this_00,&local_b8);
        std::__cxx11::string::~string((string *)&local_b8);
        std::allocator<char>::~allocator(&local_b9);
        bVar2 = cmValue::operator_cast_to_bool(&local_98);
        if (bVar2) {
          if ((this->EscapeQuotes & 1U) == 0) {
            psVar4 = cmValue::operator*[abi_cxx11_(&local_98);
            this_local = (cmCommandArgumentParserHelper *)AddString(this,psVar4);
          }
          else {
            psVar4 = cmValue::operator*[abi_cxx11_(&local_98);
            sVar1 = (string_view)
                    std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar4);
            cmEscapeQuotes_abi_cxx11_(&local_e0,sVar1);
            this_local = (cmCommandArgumentParserHelper *)AddString(this,&local_e0);
            std::__cxx11::string::~string((string *)&local_e0);
          }
        }
        else {
          this_local = (cmCommandArgumentParserHelper *)0xc7f107;
        }
      }
      else {
        std::__cxx11::ostringstream::ostringstream(local_268);
        poVar5 = std::operator<<((ostream *)local_268,"Syntax $");
        poVar5 = std::operator<<(poVar5,key);
        poVar5 = std::operator<<(poVar5,"{} is not supported.  ");
        std::operator<<(poVar5,"Only ${}, $ENV{}, and $CACHE{} are allowed.");
        std::__cxx11::ostringstream::str();
        SetError(this,&local_288);
        std::__cxx11::string::~string((string *)&local_288);
        this_local = (cmCommandArgumentParserHelper *)0x0;
        c.Value._4_4_ = 1;
        std::__cxx11::ostringstream::~ostringstream(local_268);
      }
    }
  }
  return (char *)this_local;
}

Assistant:

const char* cmCommandArgumentParserHelper::ExpandSpecialVariable(
  const char* key, const char* var)
{
  if (!key) {
    return this->ExpandVariable(var);
  }
  if (!var) {
    return "";
  }
  if (strcmp(key, "ENV") == 0) {
    std::string str;
    if (cmSystemTools::GetEnv(var, str)) {
      if (this->EscapeQuotes) {
        return this->AddString(cmEscapeQuotes(str));
      }
      return this->AddString(str);
    }
    return "";
  }
  if (strcmp(key, "CACHE") == 0) {
    if (cmValue c =
          this->Makefile->GetState()->GetInitializedCacheValue(var)) {
      if (this->EscapeQuotes) {
        return this->AddString(cmEscapeQuotes(*c));
      }
      return this->AddString(*c);
    }
    return "";
  }
  std::ostringstream e;
  e << "Syntax $" << key << "{} is not supported.  "
    << "Only ${}, $ENV{}, and $CACHE{} are allowed.";
  this->SetError(e.str());
  return nullptr;
}